

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg.cpp
# Opt level: O0

bool mg::data::mrg_write(Mrg *in,string *hed,string *mrg)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  size_type sVar5;
  const_reference pvVar6;
  void *__dest;
  void *__src;
  size_t __n;
  uint local_3c;
  uint i;
  ssize_t mrg_write_offset_sectors;
  PackedEntryHeader *headers;
  ssize_t header_size;
  string *mrg_local;
  string *hed_local;
  Mrg *in_local;
  
  std::vector<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>::size(&in->entries);
  std::__cxx11::string::resize((ulong)hed);
  lVar4 = std::__cxx11::string::data();
  iVar3 = 0;
  std::__cxx11::string::clear();
  local_3c = 0;
  while( true ) {
    sVar5 = std::vector<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>::size
                      (&in->entries);
    if (sVar5 <= local_3c) break;
    *(int *)(lVar4 + (ulong)local_3c * 8) = iVar3;
    std::vector<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>::operator[]
              (&in->entries,(ulong)local_3c);
    uVar2 = std::__cxx11::string::size();
    uVar2 = Mrg::size_in_sectors(uVar2);
    *(short *)(lVar4 + 4 + (ulong)local_3c * 8) = (short)uVar2;
    pvVar6 = std::vector<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>::operator[]
                       (&in->entries,(ulong)local_3c);
    if ((pvVar6->is_compressed & 1U) == 0) {
      std::vector<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>::operator[]
                (&in->entries,(ulong)local_3c);
      uVar2 = std::__cxx11::string::size();
      uVar2 = Mrg::size_in_sectors(uVar2);
      *(short *)(lVar4 + 6 + (ulong)local_3c * 8) = (short)uVar2;
    }
    else {
      pvVar6 = std::vector<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>::operator[]
                         (&in->entries,(ulong)local_3c);
      uVar2 = Mrg::size_in_sectors((uint)pvVar6->uncompressed_size_bytes);
      *(short *)(lVar4 + 6 + (ulong)local_3c * 8) = (short)uVar2;
    }
    cVar1 = std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)mrg,cVar1);
    __dest = (void *)std::__cxx11::string::operator[]((ulong)mrg);
    std::vector<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>::operator[]
              (&in->entries,(ulong)local_3c);
    __src = (void *)std::__cxx11::string::data();
    std::vector<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>::operator[]
              (&in->entries,(ulong)local_3c);
    __n = std::__cxx11::string::size();
    memcpy(__dest,__src,__n);
    iVar3 = (uint)*(ushort *)(lVar4 + 4 + (ulong)local_3c * 8) + iVar3;
    Mrg::PackedEntryHeader::to_file_order((PackedEntryHeader *)(lVar4 + (ulong)local_3c * 8));
    local_3c = local_3c + 1;
  }
  sVar5 = std::vector<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>::size
                    (&in->entries);
  memset((void *)(lVar4 + sVar5 * 8),0xff,0x10);
  return true;
}

Assistant:

bool mrg_write(const Mrg &in, std::string &hed, std::string &mrg) {
  // Work out the total header size
  // Note that there are 2 extra header entries of 0xFF for EOF
  const ssize_t header_size =
      (in.entries.size() + 2) * sizeof(Mrg::PackedEntryHeader);
  hed.resize(header_size);

  // Serialize each entry
  Mrg::PackedEntryHeader *headers =
      reinterpret_cast<Mrg::PackedEntryHeader *>(hed.data());
  ssize_t mrg_write_offset_sectors = 0;
  mrg.clear();
  for (unsigned i = 0; i < in.entries.size(); i++) {
    // Pack header
    headers[i].offset = mrg_write_offset_sectors;
    headers[i].size_sectors = Mrg::size_in_sectors(in.entries[i].data.size());

    // If the entry is compressed, use the correct uncompressed size
    // Else, use the normal size
    if (in.entries[i].is_compressed) {
      headers[i].size_uncompressed_sectors =
          Mrg::size_in_sectors(in.entries[i].uncompressed_size_bytes);
    } else {
      headers[i].size_uncompressed_sectors =
          Mrg::size_in_sectors(in.entries[i].data.size());
    }

    // Copy data
    mrg.resize(mrg.size() + headers[i].size_sectors * Mrg::SECTOR_SIZE, '\0');
    memcpy(&mrg[mrg_write_offset_sectors * Mrg::SECTOR_SIZE],
           in.entries[i].data.data(), in.entries[i].data.size());

    // Increment write offset
    mrg_write_offset_sectors += headers[i].size_sectors;

    // Header to file order
    headers[i].to_file_order();
  }

  // Write EOF on the HED file
  memset(&headers[in.entries.size()], 0xFF, sizeof(Mrg::PackedEntryHeader) * 2);

  return true;
}